

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

void __thiscall QExpandingLineEdit::updateMinimumWidth(QExpandingLineEdit *this)

{
  long lVar1;
  int w;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QMargins QVar3;
  QMargins QVar4;
  int local_80 [2];
  QStyleOptionFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = QLineEdit::textMargins((QLineEdit *)this);
  QVar4 = QWidget::contentsMargins((QWidget *)this);
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame(&opt);
  (**(code **)(*(long *)this + 0x1a0))(this,&opt);
  pQVar2 = QWidget::style((QWidget *)this);
  local_80[1] = 0;
  local_80[0] = QVar4.m_right.m_i.m_i +
                QVar3.m_right.m_i.m_i + QVar3.m_left.m_i.m_i + QVar4.m_left.m_i.m_i + 4;
  w = (**(code **)(*(long *)pQVar2 + 0xe8))(pQVar2,0xe,&opt,local_80,this);
  QWidget::setMinimumWidth((QWidget *)this,w);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QExpandingLineEdit::updateMinimumWidth()
{
    const QMargins tm = textMargins();
    const QMargins cm = contentsMargins();
    const int width = tm.left() + tm.right() + cm.left() + cm.right() + 4 /*horizontalMargin in qlineedit.cpp*/;

    QStyleOptionFrame opt;
    initStyleOption(&opt);

    int minWidth = style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(width, 0), this).width();
    setMinimumWidth(minWidth);
}